

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseFieldOptions
          (Parser *this,FieldDescriptorProto *field,LocationRecorder *field_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  FieldOptions *options;
  undefined1 local_40 [8];
  LocationRecorder location;
  FileDescriptorProto *containing_file_local;
  LocationRecorder *field_location_local;
  FieldDescriptorProto *field_local;
  Parser *this_local;
  
  location.location_ = (Location *)containing_file;
  bVar1 = LookingAt(this,"[");
  if (bVar1) {
    LocationRecorder::LocationRecorder((LocationRecorder *)local_40,field_location,8);
    bVar1 = Consume(this,"[");
    if (bVar1) {
      do {
        bVar1 = LookingAt(this,"default");
        if (bVar1) {
          bVar1 = ParseDefaultAssignment
                            (this,field,field_location,(FileDescriptorProto *)location.location_);
          if (!bVar1) {
            this_local._7_1_ = false;
            goto LAB_004c0748;
          }
        }
        else {
          bVar1 = LookingAt(this,"json_name");
          if (bVar1) {
            bVar1 = ParseJsonName(this,field,field_location,
                                  (FileDescriptorProto *)location.location_);
            if (!bVar1) {
              this_local._7_1_ = false;
              goto LAB_004c0748;
            }
          }
          else {
            options = FieldDescriptorProto::mutable_options(field);
            bVar1 = ParseOption(this,&options->super_Message,(LocationRecorder *)local_40,
                                (FileDescriptorProto *)location.location_,OPTION_ASSIGNMENT);
            if (!bVar1) {
              this_local._7_1_ = false;
              goto LAB_004c0748;
            }
          }
        }
        bVar1 = TryConsume(this,",");
      } while (bVar1);
      bVar1 = Consume(this,"]");
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
LAB_004c0748:
    LocationRecorder::~LocationRecorder((LocationRecorder *)local_40);
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::ParseFieldOptions(FieldDescriptorProto* field,
                               const LocationRecorder& field_location,
                               const FileDescriptorProto* containing_file) {
  if (!LookingAt("[")) return true;

  LocationRecorder location(field_location,
                            FieldDescriptorProto::kOptionsFieldNumber);

  DO(Consume("["));

  // Parse field options.
  do {
    if (LookingAt("default")) {
      // We intentionally pass field_location rather than location here, since
      // the default value is not actually an option.
      DO(ParseDefaultAssignment(field, field_location, containing_file));
    } else if (LookingAt("json_name")) {
      // Like default value, this "json_name" is not an actual option.
      DO(ParseJsonName(field, field_location, containing_file));
    } else {
      DO(ParseOption(field->mutable_options(), location,
                     containing_file, OPTION_ASSIGNMENT));
    }
  } while (TryConsume(","));

  DO(Consume("]"));
  return true;
}